

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  fstream fs;
  byte abStack_200 [496];
  
  if (argc < 2) {
    iVar2 = 0;
    processInput((istream *)&std::cin,Z80);
  }
  else {
    std::fstream::fstream(&fs);
    std::fstream::open((char *)&fs,(_Ios_Openmode)argv[1]);
    if ((abStack_200[*(long *)(_fs + -0x18)] & 5) == 0) {
      iVar2 = 0;
      processInput((istream *)&fs,Z80);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"could not open file: ");
      poVar1 = std::operator<<(poVar1,argv[1]);
      std::operator<<(poVar1,"\n");
      iVar2 = -1;
    }
    std::fstream::~fstream(&fs);
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc > 1) {
		std::fstream fs;
		fs.open(argv[1], std::fstream::in);
		if (!fs) {
			std::cerr << "could not open file: " << argv[1] << "\n";
			return -1;
		}
		return processInput(fs, Target::Z80);
	}
	else {
		return processInput(std::cin, Target::Z80);
	}
}